

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

void luaD_growstack(lua_State *L,int n)

{
  int iVar1;
  int newsize;
  
  if (1000000 < L->stacksize) {
    luaD_throw(L,6);
  }
  iVar1 = (int)((ulong)((long)L->top - (long)L->stack) >> 4) + n;
  if (iVar1 < 0xf423c) {
    iVar1 = iVar1 + 5;
    newsize = L->stacksize * 2;
    if (999999 < newsize) {
      newsize = 1000000;
    }
    if (newsize <= iVar1) {
      newsize = iVar1;
    }
    luaD_reallocstack(L,newsize);
    return;
  }
  luaD_reallocstack(L,0xf4308);
  luaG_runerror(L,"stack overflow");
}

Assistant:

void luaD_growstack (lua_State *L, int n) {
  int size = L->stacksize;
  if (size > LUAI_MAXSTACK)  /* error after extra size? */
    luaD_throw(L, LUA_ERRERR);
  else {
    int needed = cast_int(L->top - L->stack) + n + EXTRA_STACK;
    int newsize = 2 * size;
    if (newsize > LUAI_MAXSTACK) newsize = LUAI_MAXSTACK;
    if (newsize < needed) newsize = needed;
    if (newsize > LUAI_MAXSTACK) {  /* stack overflow? */
      luaD_reallocstack(L, ERRORSTACKSIZE);
      luaG_runerror(L, "stack overflow");
    }
    else
      luaD_reallocstack(L, newsize);
  }
}